

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

AsyncIoContext * kj::setupAsyncIo(void)

{
  LowLevelAsyncIoProviderImpl *this;
  AsyncIoProvider *pAVar1;
  LowLevelAsyncIoProviderImpl *ptrCopy;
  AsyncIoContext *in_RDI;
  
  this = (LowLevelAsyncIoProviderImpl *)operator_new(0x130);
  anon_unknown_30::LowLevelAsyncIoProviderImpl::LowLevelAsyncIoProviderImpl(this);
  pAVar1 = (AsyncIoProvider *)operator_new(0x78);
  pAVar1->_vptr_AsyncIoProvider = (_func_int **)&PTR_newOneWayPipe_0044c820;
  pAVar1[1]._vptr_AsyncIoProvider = (_func_int **)this;
  pAVar1[2]._vptr_AsyncIoProvider = (_func_int **)&PTR_parseAddress_0044c878;
  pAVar1[3]._vptr_AsyncIoProvider = (_func_int **)this;
  _::NetworkFilter::NetworkFilter((NetworkFilter *)(pAVar1 + 4));
  (in_RDI->lowLevelProvider).disposer =
       (Disposer *)
       &_::HeapDisposer<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl>::instance;
  (in_RDI->lowLevelProvider).ptr = (LowLevelAsyncIoProvider *)this;
  (in_RDI->provider).disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::AsyncIoProviderImpl>::instance;
  (in_RDI->provider).ptr = pAVar1;
  in_RDI->waitScope = &this->waitScope;
  in_RDI->unixEventPort = &this->eventPort;
  return in_RDI;
}

Assistant:

AsyncIoContext setupAsyncIo() {
  auto lowLevel = heap<LowLevelAsyncIoProviderImpl>();
  auto ioProvider = kj::heap<AsyncIoProviderImpl>(*lowLevel);
  auto& waitScope = lowLevel->getWaitScope();
  auto& eventPort = lowLevel->getEventPort();
  return { kj::mv(lowLevel), kj::mv(ioProvider), waitScope, eventPort };
}